

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge_sub.c
# Opt level: O3

void crypto_sign_ed25519_ref10_ge_sub(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  int32_t *h;
  int32_t *h_00;
  int32_t *h_01;
  fe t0;
  int32_t aiStack_58 [10];
  
  crypto_sign_ed25519_ref10_fe_add(r->X,p->Y,p->X);
  h = r->Y;
  crypto_sign_ed25519_ref10_fe_sub(h,p->Y,p->X);
  h_00 = r->Z;
  crypto_sign_ed25519_ref10_fe_mul(h_00,r->X,q->YminusX);
  crypto_sign_ed25519_ref10_fe_mul(h,h,q->YplusX);
  h_01 = r->T;
  crypto_sign_ed25519_ref10_fe_mul(h_01,q->T2d,p->T);
  crypto_sign_ed25519_ref10_fe_mul(r->X,p->Z,q->Z);
  crypto_sign_ed25519_ref10_fe_add(aiStack_58,r->X,r->X);
  crypto_sign_ed25519_ref10_fe_sub(r->X,h_00,h);
  crypto_sign_ed25519_ref10_fe_add(h,h_00,h);
  crypto_sign_ed25519_ref10_fe_sub(h_00,aiStack_58,h_01);
  crypto_sign_ed25519_ref10_fe_add(h_01,aiStack_58,h_01);
  return;
}

Assistant:

void ge_sub(ge_p1p1 *r,const ge_p3 *p,const ge_cached *q)
{
  fe t0;
#include "ge_sub.h"
}